

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvodes.c
# Opt level: O2

int cvHandleNFlag(CVodeMem cv_mem,int *nflagPtr,sunrealtype saved_t,int *ncfPtr,long *ncfnPtr)

{
  int iVar1;
  int iVar2;
  double dVar3;
  double dVar4;
  
  iVar2 = *nflagPtr;
  if (iVar2 == 0) {
    return 2;
  }
  *ncfnPtr = *ncfnPtr + 1;
  cvRestore(cv_mem,saved_t);
  if (iVar2 < 0) {
    if ((iVar2 + 0x33U < 0x2e) && ((0x380000100401U >> ((ulong)(iVar2 + 0x33U) & 0x3f) & 1) != 0)) {
      return iVar2;
    }
    return -0x10;
  }
  iVar1 = *ncfPtr;
  *ncfPtr = iVar1 + 1;
  cv_mem->cv_etamax = 1.0;
  if ((cv_mem->cv_hmin * 1.000001 < ABS(cv_mem->cv_h)) && (iVar1 + 1 != cv_mem->cv_maxncf)) {
    if (iVar2 != 0xb) goto switchD_0011da54_caseD_c;
    goto LAB_0011daa7;
  }
  switch(iVar2) {
  case 10:
    iVar2 = -10;
    break;
  case 0xb:
    iVar2 = -0xf;
    break;
  case 0xe:
    iVar2 = -0x21;
    break;
  case 0xf:
    iVar2 = -0x2b;
    break;
  case 0x10:
    iVar2 = -0x35;
    break;
  default:
    if (iVar2 == 0x386) {
      return -4;
    }
  case 0xc:
  case 0xd:
switchD_0011da54_caseD_c:
    dVar3 = cv_mem->cv_hmin / ABS(cv_mem->cv_h);
    dVar4 = cv_mem->cv_eta_cf;
    if (cv_mem->cv_eta_cf <= dVar3) {
      dVar4 = dVar3;
    }
    cv_mem->cv_eta = dVar4;
LAB_0011daa7:
    *nflagPtr = 7;
    cvRescale(cv_mem);
    iVar2 = 3;
  }
  return iVar2;
}

Assistant:

static int cvHandleNFlag(CVodeMem cv_mem, int* nflagPtr, sunrealtype saved_t,
                         int* ncfPtr, long int* ncfnPtr)
{
  int nflag;

  nflag = *nflagPtr;

  if (nflag == CV_SUCCESS) { return (DO_ERROR_TEST); }

  /* The nonlinear soln. failed; increment ncfn and restore zn */
  (*ncfnPtr)++;
  cvRestore(cv_mem, saved_t);

  /* Return if failed unrecoverably */
  if (nflag < 0)
  {
    if (nflag == CV_LSETUP_FAIL) { return (CV_LSETUP_FAIL); }
    else if (nflag == CV_LSOLVE_FAIL) { return (CV_LSOLVE_FAIL); }
    else if (nflag == CV_RHSFUNC_FAIL) { return (CV_RHSFUNC_FAIL); }
    else if (nflag == CV_QRHSFUNC_FAIL) { return (CV_QRHSFUNC_FAIL); }
    else if (nflag == CV_SRHSFUNC_FAIL) { return (CV_SRHSFUNC_FAIL); }
    else if (nflag == CV_QSRHSFUNC_FAIL) { return (CV_QSRHSFUNC_FAIL); }
    else { return (CV_NLS_FAIL); }
  }

  /* At this point, a recoverable error occurred. */

  (*ncfPtr)++;
  cv_mem->cv_etamax = ONE;

  /* If we had maxncf failures or |h| = hmin, return failure. */

  if ((SUNRabs(cv_mem->cv_h) <= cv_mem->cv_hmin * ONEPSM) ||
      (*ncfPtr == cv_mem->cv_maxncf))
  {
    if (nflag == SUN_NLS_CONV_RECVR) { return (CV_CONV_FAILURE); }
    if (nflag == CONSTR_RECVR) { return (CV_CONSTR_FAIL); }
    if (nflag == RHSFUNC_RECVR) { return (CV_REPTD_RHSFUNC_ERR); }
    if (nflag == QRHSFUNC_RECVR) { return (CV_REPTD_QRHSFUNC_ERR); }
    if (nflag == SRHSFUNC_RECVR) { return (CV_REPTD_SRHSFUNC_ERR); }
    if (nflag == QSRHSFUNC_RECVR) { return (CV_REPTD_QSRHSFUNC_ERR); }
  }

  /* Reduce step size; return to reattempt the step
     Note that if nflag = CONSTR_RECVR, then eta was already set in cvCheckConstraints */
  if (nflag != CONSTR_RECVR)
  {
    cv_mem->cv_eta = SUNMAX(cv_mem->cv_eta_cf,
                            cv_mem->cv_hmin / SUNRabs(cv_mem->cv_h));
  }
  *nflagPtr = PREV_CONV_FAIL;
  cvRescale(cv_mem);

  return (PREDICT_AGAIN);
}